

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O3

bool __thiscall dg::llvmdg::LLVMSlicer::removeBlock(LLVMSlicer *this,LLVMBBlock *block)

{
  BasicBlock *blk;
  _Rb_tree_node_base *p_Var1;
  BasicBlock *__range2;
  BasicBlock *pBVar2;
  long lVar3;
  BasicBlock *pBVar4;
  
  blk = (BasicBlock *)block->key;
  if (blk != (BasicBlock *)0x0) {
    for (p_Var1 = (block->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(block->nextBBs).container._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      if (((*(char *)&p_Var1[1]._M_parent != -1) && (*(LLVMBBlock **)(p_Var1 + 1) != block)) &&
         (pBVar2 = (BasicBlock *)(*(LLVMBBlock **)(p_Var1 + 1))->key, pBVar2 != (BasicBlock *)0x0))
      {
        adjustPhiNodes(pBVar2,blk);
      }
    }
    for (lVar3 = *(long *)(blk + 8); lVar3 != 0; lVar3 = *(long *)(lVar3 + 8)) {
      llvm::User::replaceUsesOfWith(*(Value **)(lVar3 + 0x18),(Value *)blk);
    }
    for (pBVar2 = *(BasicBlock **)(blk + 0x30); pBVar2 != blk + 0x28;
        pBVar2 = *(BasicBlock **)(pBVar2 + 8)) {
      pBVar4 = pBVar2 + -0x18;
      if (pBVar2 == (BasicBlock *)0x0) {
        pBVar4 = (BasicBlock *)0x0;
      }
      for (lVar3 = *(long *)((Value *)pBVar4 + 8); lVar3 != 0; lVar3 = *(long *)(lVar3 + 8)) {
        llvm::User::replaceUsesOfWith(*(Value **)(lVar3 + 0x18),(Value *)pBVar4);
      }
    }
    llvm::BasicBlock::eraseFromParent();
  }
  return true;
}

Assistant:

bool removeBlock(LLVMBBlock *block) override {
        assert(block);

        llvm::Value *val = block->getKey();
        if (val == nullptr)
            return true;

        llvm::BasicBlock *blk = llvm::cast<llvm::BasicBlock>(val);
        for (const auto &succ : block->successors()) {
            if (succ.label == LLVMBBlock::ARTIFICIAL_BBLOCK_LABEL)
                continue;

            // don't adjust phi nodes in this block if this is a self-loop,
            // we're gonna remove the block anyway
            if (succ.target == block)
                continue;

            if (llvm::Value *sval = succ.target->getKey())
                adjustPhiNodes(llvm::cast<llvm::BasicBlock>(sval), blk);
        }

        // We need to drop the reference to this block in all
        // braching instructions that jump to this block.
        // See #99
        dropAllUses(blk);

        // we also must drop refrences to instructions that are in
        // this block (or we would need to delete the blocks in
        // post-dominator order), see #101
        for (llvm::Instruction &Inst : *blk)
            dropAllUses(&Inst);

        // finally, erase the block per se
        blk->eraseFromParent();
        return true;
    }